

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::
~DoublePtrHelper(DoublePtrHelper<Diligent::IFileStream> *this)

{
  RefCntAutoPtr<Diligent::IFileStream> *this_00;
  IFileStream *pIVar1;
  
  this_00 = this->m_pAutoPtr;
  if ((this_00 != (RefCntAutoPtr<Diligent::IFileStream> *)0x0) &&
     (pIVar1 = this->NewRawPtr, this_00->m_pObject != pIVar1)) {
    RefCntAutoPtr<Diligent::IFileStream>::Release(this_00);
    this_00->m_pObject = pIVar1;
  }
  return;
}

Assistant:

~DoublePtrHelper()
        {
            if (m_pAutoPtr && *m_pAutoPtr != static_cast<T*>(NewRawPtr))
            {
                m_pAutoPtr->Attach(static_cast<T*>(NewRawPtr));
            }
        }